

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.cpp
# Opt level: O3

raw_sstring_view
pstore::get_sstring_view
          (database *db,address addr,size_t length,
          not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> owner)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _func_int **pp_Var1;
  __uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  _Var2;
  uint uVar3;
  ulong uVar4;
  raw_sstring_view rVar5;
  _func_int **local_38;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> _Stack_30;
  
  uVar4 = 9;
  if (length >> 0x38 == 0) {
    uVar3 = bit_count::clz(length | 1);
    uVar4 = 2;
    if (6 < 0x3f - uVar3) {
      uVar4 = (ulong)((0x3f - uVar3) / 7 + 1);
    }
  }
  database::getro<char,void>
            ((database *)&stack0xffffffffffffffc8,(typed_address<char>)db,uVar4 + addr.a_);
  _Var2._M_t.
  super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl =
       (tuple<std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
        )(tuple<std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
          )_Stack_30._M_head_impl;
  pp_Var1 = local_38;
  local_38 = (_func_int **)0x0;
  _Stack_30._M_head_impl = (array<pstore::sat_entry,_65536UL> *)0x0;
  this = ((owner.ptr_)->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ._M_pi;
  ((owner.ptr_)->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pp_Var1;
  ((owner.ptr_)->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         _Var2._M_t.
         super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl;
  if (this == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (owner.ptr_)->size_ = length;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    (owner.ptr_)->size_ = length;
    if ((_Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>)_Stack_30._M_head_impl !=
        (_Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_30._M_head_impl);
    }
  }
  rVar5.size_ = length;
  rVar5.ptr_ = ((owner.ptr_)->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
  return rVar5;
}

Assistant:

raw_sstring_view get_sstring_view (database const & db, address const addr,
                                       std::size_t const length,
                                       gsl::not_null<shared_sstring_view *> const owner) {
        *owner =
            shared_sstring_view{db.getro (typed_address<char>::make (
                                              addr + std::max (varint::encoded_size (length), 2U)),
                                          length),
                                length};
        return {owner->data (), length};
    }